

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

DishType __thiscall Restaurant::findMyType(Restaurant *this,string *strType)

{
  bool bVar1;
  string *strType_local;
  Restaurant *this_local;
  
  bVar1 = std::operator==(strType,"ALC");
  if (bVar1) {
    this_local._4_4_ = ALC;
  }
  else {
    bVar1 = std::operator==(strType,"VEG");
    if (bVar1) {
      this_local._4_4_ = VEG;
    }
    else {
      bVar1 = std::operator==(strType,"SPC");
      if (bVar1) {
        this_local._4_4_ = SPC;
      }
      else {
        this_local._4_4_ = BVG;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

DishType Restaurant::findMyType(std::string strType)
{
    if(strType == "ALC")
        return ALC;
    if(strType == "VEG")
        return VEG;
    if(strType == "SPC")
        return SPC;
    else
        return BVG;
}